

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

void __thiscall
jaegertracing::agent::thrift::AgentConcurrentClient::send_emitZipkinBatch
          (AgentConcurrentClient *this,
          vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_>
          *spans)

{
  TProtocol *this_00;
  element_type *peVar1;
  void *__buf;
  undefined1 local_98 [16];
  undefined1 local_88 [24];
  Agent_emitZipkinBatch_pargs args;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  TConcurrentSendSentry sentry;
  int32_t cseqid;
  vector<twitter::zipkin::thrift::Span,_std::allocator<twitter::zipkin::thrift::Span>_> *spans_local
  ;
  AgentConcurrentClient *this_local;
  
  sentry._12_4_ = 0;
  apache::thrift::async::TConcurrentSendSentry::TConcurrentSendSentry
            ((TConcurrentSendSentry *)local_30,&this->sync_);
  this_00 = this->oprot_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"emitZipkinBatch",&local_51);
  apache::thrift::protocol::TProtocol::writeMessageBegin(this_00,&local_50,T_ONEWAY,sentry._12_4_);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Agent_emitZipkinBatch_pargs::Agent_emitZipkinBatch_pargs
            ((Agent_emitZipkinBatch_pargs *)(local_88 + 0x10));
  args._vptr_Agent_emitZipkinBatch_pargs = (_func_int **)spans;
  Agent_emitZipkinBatch_pargs::write
            ((Agent_emitZipkinBatch_pargs *)(local_88 + 0x10),(int)this->oprot_,__buf,(size_t)spans)
  ;
  apache::thrift::protocol::TProtocol::writeMessageEnd(this->oprot_);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_88);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  (*peVar1->_vptr_TTransport[10])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_88);
  apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_98);
  peVar1 = std::
           __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_98);
  (*peVar1->_vptr_TTransport[0xb])();
  std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
            ((shared_ptr<apache::thrift::transport::TTransport> *)local_98);
  apache::thrift::async::TConcurrentSendSentry::commit((TConcurrentSendSentry *)local_30);
  Agent_emitZipkinBatch_pargs::~Agent_emitZipkinBatch_pargs
            ((Agent_emitZipkinBatch_pargs *)(local_88 + 0x10));
  apache::thrift::async::TConcurrentSendSentry::~TConcurrentSendSentry
            ((TConcurrentSendSentry *)local_30);
  return;
}

Assistant:

void AgentConcurrentClient::send_emitZipkinBatch(const std::vector< ::twitter::zipkin::thrift::Span> & spans)
{
  int32_t cseqid = 0;
  ::apache::thrift::async::TConcurrentSendSentry sentry(&this->sync_);
  oprot_->writeMessageBegin("emitZipkinBatch", ::apache::thrift::protocol::T_ONEWAY, cseqid);

  Agent_emitZipkinBatch_pargs args;
  args.spans = &spans;
  args.write(oprot_);

  oprot_->writeMessageEnd();
  oprot_->getTransport()->writeEnd();
  oprot_->getTransport()->flush();

  sentry.commit();
}